

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::StrCaseNeHelper::Assertion<wchar_t_const*,wchar_t_const*>
          (AssertionResult *__return_storage_ptr__,StrCaseNeHelper *this,char *expr1,char *expr2,
          wchar_t **val1,wchar_t **val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  AssertionResult local_58;
  internal *local_30;
  wchar_t **val2_local;
  wchar_t **val1_local;
  char *expr2_local;
  char *expr1_local;
  
  local_30 = (internal *)val1;
  val2_local = (wchar_t **)expr2;
  val1_local = (wchar_t **)expr1;
  expr2_local = (char *)this;
  expr1_local = (char *)__return_storage_ptr__;
  bVar1 = Compare<wchar_t_const*,wchar_t_const*>((wchar_t **)expr2,val1);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_58,(char (*) [18])"error: Expected: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr2_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" != ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&val1_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [17])" (ignoring case)");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])0x544e98);
    FormatForComparisonFailureMessage<wchar_t_const*,wchar_t_const*>
              (&local_a8,local_30,val2_local,(wchar_t **)expr2);
    detail::ShowStringQuoted(&local_88,&local_a8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_88);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
    FormatForComparisonFailureMessage<wchar_t_const*,wchar_t_const*>
              (&local_e8,(internal *)val2_local,(wchar_t **)local_30,(wchar_t **)expr2);
    detail::ShowStringQuoted(&local_c8,&local_e8);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_c8);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    AssertionResult::~AssertionResult(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(
    const char* expr1, const char* expr2
        , const T1& val1, const T2& val2)
{
    if IUTEST_COND_LIKELY( Compare(val1, val2) )
    {
        return AssertionSuccess();
    }

    return AssertionFailure() << "error: Expected: " << expr1 << " != " << expr2 << " (ignoring case)"
        << "\n  Actual: " << detail::ShowStringQuoted(FormatForComparisonFailureMessage(val2, val1))
        << " vs " << detail::ShowStringQuoted(FormatForComparisonFailureMessage(val1, val2));
}